

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall MemorySSADumper::dumpSubgraphLabel(MemorySSADumper *this,RWSubgraph *subgraph)

{
  DataDependenceAnalysisImpl *this_00;
  Summary *pSVar1;
  undefined8 uVar2;
  RWSubgraph *in_RSI;
  Summary *summary;
  MemorySSATransformation *SSA;
  DefinitionsMap<dg::dda::RWNode> *in_stack_00000038;
  MemorySSADumper *in_stack_00000040;
  RWSubgraph *in_stack_ffffffffffffffe0;
  
  dg::dda::LLVMDataDependenceAnalysis::getDDA((LLVMDataDependenceAnalysis *)0x177960);
  this_00 = dg::dda::DataDependenceAnalysis::getImpl((DataDependenceAnalysis *)0x177968);
  pSVar1 = dg::dda::MemorySSATransformation::getSummary
                     ((MemorySSATransformation *)this_00,in_stack_ffffffffffffffe0);
  if (pSVar1 == (Summary *)0x0) {
    dg::dda::RWSubgraph::getName_abi_cxx11_(in_RSI);
    uVar2 = std::__cxx11::string::c_str();
    printf("  label=<<table cellborder=\"0\">\n<tr><td>subgraph %s(%p)</td></tr>\n<tr><td>no summary</td></tr></table>>;\n"
           ,uVar2,in_RSI);
  }
  else {
    dg::dda::RWSubgraph::getName_abi_cxx11_(in_RSI);
    uVar2 = std::__cxx11::string::c_str();
    printf("  label=<<table cellborder=\"0\"><tr><td colspan=\"4\">subgraph %s (%p)</td></tr>\n<tr><td colspan=\"4\">-- summary -- </td></tr>\n"
           ,uVar2,in_RSI);
    printf("<tr><td colspan=\"4\">==  inputs ==</td></tr>");
    dumpDDIMap(in_stack_00000040,in_stack_00000038);
    printf("<tr><td colspan=\"4\">==  outputs ==</td></tr>");
    dumpDDIMap(in_stack_00000040,in_stack_00000038);
    printf("</table>>;\n");
  }
  return;
}

Assistant:

void dumpSubgraphLabel(RWSubgraph *subgraph) override {
        auto *SSA = static_cast<MemorySSATransformation *>(
                DDA->getDDA()->getImpl());
        const auto *summary = SSA->getSummary(subgraph);

        if (!summary) {
            printf("  label=<<table cellborder=\"0\">\n"
                   "<tr><td>subgraph %s(%p)</td></tr>\n"
                   "<tr><td>no summary</td></tr></table>>;\n",
                   subgraph->getName().c_str(), subgraph);
            return;
        }

        printf("  label=<<table cellborder=\"0\"><tr><td "
               "colspan=\"4\">subgraph %s (%p)</td></tr>\n"
               "<tr><td colspan=\"4\">-- summary -- </td></tr>\n",
               subgraph->getName().c_str(), subgraph);
        printf("<tr><td colspan=\"4\">==  inputs ==</td></tr>");
        dumpDDIMap(summary->inputs);
        printf("<tr><td colspan=\"4\">==  outputs ==</td></tr>");
        dumpDDIMap(summary->outputs);
        printf("</table>>;\n");
    }